

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDisjointSets.h
# Opt level: O0

void __thiscall
HighsDisjointSets<false>::merge(HighsDisjointSets<false> *this,HighsInt item1,HighsInt item2)

{
  int iVar1;
  HighsInt item;
  HighsInt HVar2;
  reference pvVar3;
  undefined4 in_EDX;
  undefined4 in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  HighsInt repr2;
  HighsInt repr1;
  HighsInt in_stack_ffffffffffffffec;
  int iVar4;
  
  item = getSet((HighsDisjointSets<false> *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  HVar2 = getSet((HighsDisjointSets<false> *)CONCAT44(in_ESI,in_EDX),item);
  if (item != HVar2) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)item);
    iVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)HVar2);
    if (*pvVar3 < iVar1) {
      iVar4 = item;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 1,(long)HVar2);
      *pvVar3 = item;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)HVar2);
      iVar1 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)iVar4);
      *pvVar3 = iVar1 + *pvVar3;
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 1,(long)item);
      *pvVar3 = HVar2;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)item);
      iVar1 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)HVar2);
      *pvVar3 = iVar1 + *pvVar3;
    }
  }
  return;
}

Assistant:

void merge(HighsInt item1, HighsInt item2) {
    assert(item1 >= 0 && item1 < (HighsInt)sets.size());
    assert(item2 >= 0 && item2 < (HighsInt)sets.size());

    HighsInt repr1 = getSet(item1);
    assert(sets[repr1] == repr1);
    assert(repr1 >= 0 && repr1 < (HighsInt)sets.size());

    HighsInt repr2 = getSet(item2);
    assert(sets[repr2] == repr2);
    assert(repr2 >= 0 && repr2 < (HighsInt)sets.size());
    assert(sizes.size() == sets.size());

    if (repr1 == repr2) return;

    if (kMinimalRepresentative) {
      if (repr2 > repr1) {
        sets[repr2] = repr1;
        sizes[repr1] += sizes[repr2];
      } else {
        sets[repr1] = repr2;
        sizes[repr2] += sizes[repr1];
      }
    } else {
      if (sizes[repr1] > sizes[repr2]) {
        sets[repr2] = repr1;
        sizes[repr1] += sizes[repr2];
      } else {
        sets[repr1] = repr2;
        sizes[repr2] += sizes[repr1];
      }
    }
  }